

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void last_wal_flush_header_test(void)

{
  fdb_encryption_key new_key;
  void *ptr;
  fdb_doc *doc;
  long lVar1;
  fdb_iterator **ppfVar2;
  fdb_status fVar3;
  int iVar4;
  fdb_kvs_handle **ptr_handle;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  fdb_kvs_handle *pfVar8;
  uint uVar9;
  long lVar10;
  fdb_doc **ppfVar11;
  fdb_doc *pfVar12;
  char *ptr_handle_00;
  fdb_config *pfVar13;
  fdb_doc *__s;
  char *pcVar14;
  ulong uVar15;
  fdb_iterator **doc_00;
  fdb_file_handle **ptr_fhandle;
  fdb_doc **doc_01;
  fdb_iterator **ptr_iterator;
  fdb_kvs_handle **ptr_handle_01;
  char *handle;
  bool bVar16;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile_txn1;
  fdb_kvs_handle *db_txn1;
  fdb_file_handle *dbfile;
  fdb_file_handle *dbfile_txn2;
  fdb_kvs_handle *db_txn2;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  char keybuf [256];
  char bodybuf [256];
  char metabuf [256];
  fdb_kvs_handle *pfStack_1b4f0;
  fdb_file_handle *pfStack_1b4e8;
  void *pvStack_1b4e0;
  size_t asStack_1b4d8 [3];
  undefined4 uStack_1b4c0;
  undefined4 uStack_1b4bc;
  undefined4 uStack_1b4b8;
  undefined4 uStack_1b4b4;
  undefined4 uStack_1b4b0;
  fdb_kvs_config fStack_1b4a8;
  timeval tStack_1b490;
  fdb_config fStack_1b480;
  char acStack_1b388 [256];
  char acStack_1b288 [256];
  char acStack_1b188 [264];
  fdb_config *pfStack_1b080;
  fdb_iterator **ppfStack_1b078;
  fdb_kvs_handle *pfStack_1b070;
  fdb_iterator **ppfStack_1b068;
  fdb_kvs_handle *pfStack_1b060;
  code *pcStack_1b058;
  fdb_iterator *pfStack_1b040;
  fdb_file_handle *pfStack_1b038;
  fdb_kvs_handle *pfStack_1b030;
  fdb_kvs_handle *pfStack_1b028;
  fdb_kvs_config fStack_1b020;
  timeval tStack_1b008;
  fdb_config fStack_1aff8;
  fdb_iterator *apfStack_1af00 [32];
  fdb_config fStack_1ae00;
  fdb_kvs_handle **ppfStack_1acf8;
  fdb_iterator **ppfStack_1acf0;
  fdb_iterator **ppfStack_1ace8;
  fdb_kvs_handle *pfStack_1ace0;
  fdb_iterator *pfStack_1acd0;
  fdb_kvs_handle *pfStack_1acc8;
  fdb_iterator **ppfStack_1acc0;
  fdb_kvs_handle *pfStack_1acb8;
  fdb_kvs_config fStack_1acb0;
  fdb_kvs_handle *apfStack_1ac98 [8];
  undefined1 auStack_1ac58 [64];
  fdb_iterator *apfStack_1ac18 [33];
  fdb_config fStack_1ab10;
  fdb_iterator *apfStack_1aa18 [32];
  fdb_iterator *apfStack_1a918 [32];
  fdb_kvs_handle fStack_1a818;
  undefined8 auStack_1a418 [896];
  fdb_kvs_handle *apfStack_18818 [1025];
  fdb_doc **ppfStack_16810;
  char *pcStack_16808;
  long lStack_16800;
  fdb_doc *pfStack_167f8;
  fdb_doc **ppfStack_167f0;
  fdb_doc *pfStack_167e8;
  fdb_doc *pfStack_167d0;
  fdb_file_handle *pfStack_167c8;
  long lStack_167c0;
  fdb_kvs_handle *pfStack_167b8;
  long lStack_167b0;
  long lStack_167a8;
  fdb_doc **ppfStack_167a0;
  long lStack_16798;
  fdb_doc **ppfStack_16790;
  size_t sStack_16788;
  timeval tStack_16780;
  fdb_kvs_config fStack_16770;
  fdb_file_info fStack_16758;
  fdb_doc afStack_16710 [3];
  char acStack_16610 [264];
  fdb_config fStack_16508;
  char acStack_16410 [256];
  fdb_doc *apfStack_16310 [2999];
  size_t sStack_10558;
  size_t asStack_10550 [1023];
  undefined1 auStack_e551 [57225];
  fdb_doc **ppfStack_5c8;
  fdb_config *pfStack_5c0;
  fdb_file_handle **ppfStack_5b8;
  ulong uStack_5b0;
  fdb_kvs_handle **ppfStack_5a8;
  fdb_kvs_handle **ppfStack_5a0;
  fdb_doc *local_588;
  fdb_kvs_handle *local_580;
  undefined1 local_578 [24];
  fdb_file_handle *local_560;
  fdb_kvs_handle *local_558;
  fdb_kvs_config local_550;
  fdb_doc *local_538 [31];
  timeval local_440;
  fdb_config local_430;
  char local_338 [256];
  fdb_file_handle *local_238 [32];
  char local_138 [264];
  
  ppfStack_5a0 = (fdb_kvs_handle **)0x1185a2;
  gettimeofday(&local_440,(__timezone_ptr_t)0x0);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1185a7;
  memleak_start();
  local_588 = (fdb_doc *)0x0;
  ppfStack_5a0 = (fdb_kvs_handle **)0x1185b8;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_5a0 = (fdb_kvs_handle **)0x1185c8;
  fdb_get_default_config();
  ppfStack_5a0 = (fdb_kvs_handle **)0x1185d5;
  fdb_get_default_kvs_config();
  local_430.buffercache_size = 0;
  local_430.flags = 1;
  local_430.purging_interval = 0;
  local_430.compaction_threshold = '\0';
  ppfStack_5a0 = (fdb_kvs_handle **)0x118608;
  fdb_open((fdb_file_handle **)(local_578 + 0x10),"dummy1",&local_430);
  ppfStack_5a0 = (fdb_kvs_handle **)0x11861b;
  fdb_open((fdb_file_handle **)local_578,"dummy1",&local_430);
  ppfStack_5a0 = (fdb_kvs_handle **)0x11862c;
  fdb_kvs_open_default((fdb_file_handle *)local_578._16_8_,&local_580,&local_550);
  ppfStack_5a0 = (fdb_kvs_handle **)0x11863d;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_578._0_8_,(fdb_kvs_handle **)(local_578 + 8),&local_550);
  ppfVar11 = local_538;
  uVar15 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x118661;
    sprintf(local_338,"key%d",uVar15 & 0xffffffff);
    ppfStack_5a0 = (fdb_kvs_handle **)0x11867d;
    sprintf(local_138,"meta%d",uVar15 & 0xffffffff);
    ptr_fhandle = local_238;
    ppfStack_5a0 = (fdb_kvs_handle **)0x118699;
    sprintf((char *)ptr_fhandle,"body%d",uVar15 & 0xffffffff);
    ppfStack_5a0 = (fdb_kvs_handle **)0x1186a1;
    ptr_handle = (fdb_kvs_handle **)strlen(local_338);
    ppfStack_5a0 = (fdb_kvs_handle **)0x1186ac;
    sVar5 = strlen(local_138);
    ppfStack_5a0 = (fdb_kvs_handle **)0x1186b7;
    sVar6 = strlen((char *)ptr_fhandle);
    ppfStack_5a0 = (fdb_kvs_handle **)0x1186d7;
    fdb_doc_create(ppfVar11,local_338,(size_t)ptr_handle,local_138,sVar5,ptr_fhandle,sVar6);
    uVar15 = uVar15 + 1;
    ppfVar11 = ppfVar11 + 1;
  } while (uVar15 != 0x1e);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1186f7;
  fdb_set(local_580,local_538[0]);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118706;
  fdb_set(local_580,local_538[1]);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118715;
  fdb_begin_transaction((fdb_file_handle *)local_578._0_8_,'\x02');
  lVar10 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x118726;
    fdb_set((fdb_kvs_handle *)local_578._8_8_,local_538[lVar10 + 2]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118741;
  fdb_commit((fdb_file_handle *)local_578._16_8_,'\x01');
  ppfStack_5a0 = (fdb_kvs_handle **)0x118749;
  fdb_close((fdb_file_handle *)local_578._16_8_);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118756;
  fdb_close((fdb_file_handle *)local_578._0_8_);
  ptr_handle_01 = (fdb_kvs_handle **)0x1541a5;
  pfVar13 = &local_430;
  ppfStack_5a0 = (fdb_kvs_handle **)0x118773;
  fdb_open((fdb_file_handle **)(local_578 + 0x10),"dummy1",pfVar13);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118781;
  fdb_open((fdb_file_handle **)local_578,"dummy1",pfVar13);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118796;
  fdb_kvs_open_default((fdb_file_handle *)local_578._16_8_,&local_580,&local_550);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1187a6;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_578._0_8_,(fdb_kvs_handle **)(local_578 + 8),&local_550);
  uVar15 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x1187d2;
    fdb_doc_create(&local_588,local_538[uVar15]->key,local_538[uVar15]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    ppfStack_5a0 = (fdb_kvs_handle **)0x1187e1;
    fVar3 = fdb_get(local_580,local_588);
    if (uVar15 < 2) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118d89;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118d8e;
    ppfStack_5a0 = (fdb_kvs_handle **)0x118802;
    fdb_doc_free(local_588);
    local_588 = (fdb_doc *)0x0;
    uVar15 = uVar15 + 1;
  } while (uVar15 != 4);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118823;
  fdb_begin_transaction((fdb_file_handle *)local_578._0_8_,'\x02');
  lVar10 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x118834;
    fdb_set((fdb_kvs_handle *)local_578._8_8_,local_538[lVar10 + 2]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  lVar10 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x118851;
    fdb_set(local_580,local_538[lVar10 + 4]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_5a0 = (fdb_kvs_handle **)0x11886c;
  fdb_end_transaction((fdb_file_handle *)local_578._0_8_,'\x01');
  ppfStack_5a0 = (fdb_kvs_handle **)0x118879;
  fdb_close((fdb_file_handle *)local_578._16_8_);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118881;
  fdb_close((fdb_file_handle *)local_578._0_8_);
  ptr_handle_01 = (fdb_kvs_handle **)0x1541a5;
  pfVar13 = &local_430;
  ppfStack_5a0 = (fdb_kvs_handle **)0x11889e;
  fdb_open((fdb_file_handle **)(local_578 + 0x10),"dummy1",pfVar13);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1188ac;
  fdb_open((fdb_file_handle **)local_578,"dummy1",pfVar13);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1188c1;
  fdb_kvs_open_default((fdb_file_handle *)local_578._16_8_,&local_580,&local_550);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1188d1;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_578._0_8_,(fdb_kvs_handle **)(local_578 + 8),&local_550);
  uVar15 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x1188fd;
    fdb_doc_create(&local_588,local_538[uVar15]->key,local_538[uVar15]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    ppfStack_5a0 = (fdb_kvs_handle **)0x11890c;
    fVar3 = fdb_get(local_580,local_588);
    if ((uVar15 < 4) && (fVar3 != FDB_RESULT_SUCCESS)) {
      ppfStack_5a0 = (fdb_kvs_handle **)0x118d84;
      last_wal_flush_header_test();
      goto LAB_00118d84;
    }
    ppfStack_5a0 = (fdb_kvs_handle **)0x118924;
    fdb_doc_free(local_588);
    local_588 = (fdb_doc *)0x0;
    uVar15 = uVar15 + 1;
  } while (uVar15 != 6);
  lVar10 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x11894a;
    fdb_set(local_580,local_538[lVar10 + 4]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118962;
  fdb_begin_transaction((fdb_file_handle *)local_578._0_8_,'\x02');
  lVar10 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x118976;
    fdb_set((fdb_kvs_handle *)local_578._8_8_,local_538[lVar10 + 6]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_5a0 = (fdb_kvs_handle **)0x11898e;
  fdb_commit((fdb_file_handle *)local_578._16_8_,'\x01');
  ppfStack_5a0 = (fdb_kvs_handle **)0x1189aa;
  fdb_open(&local_560,"dummy1",&local_430);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1189bc;
  fdb_kvs_open_default(local_560,&local_558,&local_550);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1189c9;
  fdb_begin_transaction(local_560,'\x02');
  lVar10 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x1189dd;
    fdb_set(local_558,local_538[lVar10 + 8]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_5a0 = (fdb_kvs_handle **)0x1189f5;
  fdb_end_transaction(local_560,'\x01');
  ppfStack_5a0 = (fdb_kvs_handle **)0x118a02;
  fdb_close((fdb_file_handle *)local_578._16_8_);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118a0c;
  fdb_close((fdb_file_handle *)local_578._0_8_);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118a16;
  fdb_close(local_560);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118a2d;
  fdb_open((fdb_file_handle **)(local_578 + 0x10),"dummy1",&local_430);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118a3f;
  fdb_kvs_open_default((fdb_file_handle *)local_578._16_8_,&local_580,&local_550);
  uVar15 = 0;
  do {
    ppfStack_5a0 = (fdb_kvs_handle **)0x118a6b;
    fdb_doc_create(&local_588,local_538[uVar15]->key,local_538[uVar15]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    ppfStack_5a0 = (fdb_kvs_handle **)0x118a7a;
    fVar3 = fdb_get(local_580,local_588);
    if ((int)uVar15 - 8U < 0xfffffffe) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118d93;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118d98;
    ppfStack_5a0 = (fdb_kvs_handle **)0x118a9e;
    fdb_doc_free(local_588);
    local_588 = (fdb_doc *)0x0;
    uVar15 = uVar15 + 1;
  } while (uVar15 != 10);
  pfVar13 = (fdb_config *)local_578;
  ppfStack_5a0 = (fdb_kvs_handle **)0x118ad2;
  fdb_open((fdb_file_handle **)pfVar13,"dummy1",&local_430);
  ptr_fhandle = &local_560;
  ppfStack_5a0 = (fdb_kvs_handle **)0x118ae5;
  fdb_open(ptr_fhandle,"dummy1",&local_430);
  ptr_handle_01 = (fdb_kvs_handle **)(local_578 + 8);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118afe;
  fdb_kvs_open_default((fdb_file_handle *)local_578._0_8_,ptr_handle_01,&local_550);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118b12;
  fdb_kvs_open_default(local_560,&local_558,&local_550);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118b20;
  fdb_begin_transaction((fdb_file_handle *)local_578._0_8_,'\x02');
  ptr_handle = &local_580;
  ppfStack_5a0 = (fdb_kvs_handle **)0x118b36;
  fdb_set(local_580,local_538[10]);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118b48;
  fdb_commit((fdb_file_handle *)local_578._16_8_,'\x01');
  ppfStack_5a0 = (fdb_kvs_handle **)0x118b59;
  fdb_set(local_580,local_538[0xb]);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118b69;
  fdb_set((fdb_kvs_handle *)local_578._8_8_,local_538[0xc]);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118b76;
  fdb_commit((fdb_file_handle *)local_578._16_8_,'\x01');
  ppfStack_5a0 = (fdb_kvs_handle **)0x118b86;
  fdb_set((fdb_kvs_handle *)local_578._8_8_,local_538[0xd]);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118b94;
  fdb_begin_transaction(local_560,'\x02');
  ppfStack_5a0 = (fdb_kvs_handle **)0x118ba4;
  fdb_set(local_558,local_538[0xe]);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118bb2;
  fdb_end_transaction((fdb_file_handle *)local_578._0_8_,'\x01');
  ppfStack_5a0 = (fdb_kvs_handle **)0x118bc2;
  fdb_set(local_558,local_538[0xf]);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118bd3;
  fdb_set(local_580,local_538[0x10]);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118be1;
  fdb_end_transaction(local_560,'\x01');
  ppfStack_5a0 = (fdb_kvs_handle **)0x118bf2;
  fdb_set(local_580,local_538[0x11]);
  uVar15 = 0;
  ppfStack_5a0 = (fdb_kvs_handle **)0x118bff;
  fdb_commit((fdb_file_handle *)local_578._16_8_,'\0');
  ppfStack_5a0 = (fdb_kvs_handle **)0x118c07;
  fdb_close((fdb_file_handle *)local_578._16_8_);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118c10;
  fdb_close((fdb_file_handle *)local_578._0_8_);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118c19;
  fdb_close(local_560);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118c30;
  fdb_open((fdb_file_handle **)(local_578 + 0x10),"dummy1",&local_430);
  ppfStack_5a0 = (fdb_kvs_handle **)0x118c40;
  fdb_kvs_open_default((fdb_file_handle *)local_578._16_8_,ptr_handle,&local_550);
  while( true ) {
    ppfStack_5a0 = (fdb_kvs_handle **)0x118c6c;
    fdb_doc_create(&local_588,local_538[uVar15 + 10]->key,local_538[uVar15 + 10]->keylen,(void *)0x0
                   ,0,(void *)0x0,0);
    ppfStack_5a0 = (fdb_kvs_handle **)0x118c7b;
    fVar3 = fdb_get(local_580,local_588);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ppfStack_5a0 = (fdb_kvs_handle **)0x118c8d;
    fdb_doc_free(local_588);
    local_588 = (fdb_doc *)0x0;
    uVar15 = uVar15 + 1;
    if (uVar15 == 8) {
      ppfStack_5a0 = (fdb_kvs_handle **)0x118cbb;
      fdb_open((fdb_file_handle **)local_578,"dummy1",&local_430);
      ppfStack_5a0 = (fdb_kvs_handle **)0x118cd0;
      fdb_kvs_open_default
                ((fdb_file_handle *)local_578._0_8_,(fdb_kvs_handle **)(local_578 + 8),&local_550);
      ppfStack_5a0 = (fdb_kvs_handle **)0x118cdd;
      fdb_begin_transaction((fdb_file_handle *)local_578._0_8_,'\x02');
      ppfStack_5a0 = (fdb_kvs_handle **)0x118ced;
      fdb_set((fdb_kvs_handle *)local_578._8_8_,local_538[0x14]);
      ppfStack_5a0 = (fdb_kvs_handle **)0x118cfe;
      fdb_compact((fdb_file_handle *)local_578._16_8_,"dummy2");
      ppfStack_5a0 = (fdb_kvs_handle **)0x118d0b;
      fdb_end_transaction((fdb_file_handle *)local_578._0_8_,'\x01');
      ppfStack_5a0 = (fdb_kvs_handle **)0x118d15;
      fdb_close((fdb_file_handle *)local_578._16_8_);
      ppfStack_5a0 = (fdb_kvs_handle **)0x118d1d;
      fdb_close((fdb_file_handle *)local_578._0_8_);
      lVar10 = 0;
      do {
        ppfStack_5a0 = (fdb_kvs_handle **)0x118d29;
        fdb_doc_free(local_538[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x1e);
      ppfStack_5a0 = (fdb_kvs_handle **)0x118d37;
      fdb_shutdown();
      ppfStack_5a0 = (fdb_kvs_handle **)0x118d3c;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (last_wal_flush_header_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      ppfStack_5a0 = (fdb_kvs_handle **)0x118d6d;
      fprintf(_stderr,pcVar14,"last wal flush header test");
      return;
    }
  }
LAB_00118d84:
  ppfStack_5a0 = (fdb_kvs_handle **)0x118d89;
  last_wal_flush_header_test();
LAB_00118d89:
  ppfStack_5a0 = (fdb_kvs_handle **)0x118d8e;
  last_wal_flush_header_test();
LAB_00118d8e:
  ppfStack_5a0 = (fdb_kvs_handle **)0x118d93;
  last_wal_flush_header_test();
LAB_00118d93:
  ppfStack_5a0 = (fdb_kvs_handle **)0x118d98;
  last_wal_flush_header_test();
LAB_00118d98:
  ppfStack_5a0 = (fdb_kvs_handle **)long_key_test;
  last_wal_flush_header_test();
  pfStack_167e8 = (fdb_doc *)0x118dba;
  ppfStack_5c8 = &local_588;
  pfStack_5c0 = pfVar13;
  ppfStack_5b8 = ptr_fhandle;
  uStack_5b0 = uVar15;
  ppfStack_5a8 = ptr_handle_01;
  ppfStack_5a0 = ptr_handle;
  gettimeofday(&tStack_16780,(__timezone_ptr_t)0x0);
  pfStack_167e8 = (fdb_doc *)0x118dbf;
  memleak_start();
  pfStack_167d0 = (fdb_doc *)0x0;
  pfStack_167e8 = (fdb_doc *)0x118dd4;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_167e8 = (fdb_doc *)0x118de4;
  fdb_get_default_config();
  pfStack_167e8 = (fdb_doc *)0x118df1;
  fdb_get_default_kvs_config();
  fStack_16508.flags = 1;
  fStack_16508.purging_interval = 0;
  fStack_16508.compaction_threshold = '\0';
  fStack_16508.durability_opt = '\x02';
  pfStack_167e8 = (fdb_doc *)0x118e1e;
  fdb_open(&pfStack_167c8,"dummy1",&fStack_16508);
  pfStack_167e8 = (fdb_doc *)0x118e2e;
  fdb_kvs_open_default(pfStack_167c8,&pfStack_167b8,&fStack_16770);
  ppfVar11 = apfStack_16310;
  __s = afStack_16710;
  pfVar12 = (fdb_doc *)0x0;
  lVar10 = 0;
  do {
    sVar5 = 0xff7f;
    if (lVar10 == 1) {
      sVar5 = 0x1fff;
    }
    if (lVar10 == 0) {
      sVar5 = 0x7fff;
    }
    pfStack_167e8 = (fdb_doc *)0x118e7c;
    lStack_167b0 = lVar10;
    memset(asStack_10550,0x5f,sVar5);
    *(undefined1 *)((long)asStack_10550 + sVar5) = 0;
    lVar10 = 0;
    doc_01 = ppfVar11;
    lStack_167a8 = (long)pfVar12;
    ppfStack_167a0 = ppfVar11;
    sStack_16788 = sVar5;
    do {
      pfStack_167e8 = (fdb_doc *)0x118eb2;
      lStack_16798 = lVar10;
      sprintf((char *)__s,"%08d");
      asStack_10550[0] = afStack_16710[0].keylen;
      uVar15 = 0;
      lStack_167c0 = (long)pfVar12;
      ppfStack_16790 = doc_01;
      do {
        pfStack_167e8 = (fdb_doc *)0x118eee;
        sprintf((char *)__s,"%08d",uVar15 & 0xffffffff);
        *(size_t *)((long)apfStack_16310 + sStack_16788 + 0x5db8) = afStack_16710[0].keylen;
        uVar9 = (int)lStack_167c0 + (int)uVar15;
        pfStack_167e8 = (fdb_doc *)0x118f27;
        sprintf(acStack_16410,"meta%d",(ulong)uVar9);
        pfStack_167e8 = (fdb_doc *)0x118f3a;
        sprintf(acStack_16610,"body%d",(ulong)uVar9);
        pfStack_167e8 = (fdb_doc *)0x118f47;
        sVar5 = strlen((char *)asStack_10550);
        pfStack_167e8 = (fdb_doc *)0x118f53;
        sVar6 = strlen(acStack_16410);
        pfStack_167e8 = (fdb_doc *)0x118f67;
        sVar7 = strlen(acStack_16610);
        lVar1 = lStack_167c0;
        pcVar14 = acStack_16610;
        pfStack_167e8 = (fdb_doc *)0x118f9a;
        fdb_doc_create(doc_01,asStack_10550,sVar5 + 1,acStack_16410,sVar6 + 1,pcVar14,sVar7 + 1);
        uVar15 = uVar15 + 1;
        doc_01 = doc_01 + 1;
      } while (uVar15 != 10);
      lVar10 = lStack_16798 + 1;
      doc_01 = ppfStack_16790 + 10;
      pfVar12 = (fdb_doc *)(lVar1 + 10);
    } while (lVar10 != 100);
    lVar10 = lStack_167b0 + 1;
    ppfVar11 = ppfStack_167a0 + 1000;
    pfVar12 = (fdb_doc *)(lStack_167a8 + 1000);
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pfStack_167e8 = (fdb_doc *)0x119010;
    fdb_set(pfStack_167b8,apfStack_16310[lVar10]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3000);
  pfStack_167e8 = (fdb_doc *)0x11902b;
  fdb_commit(pfStack_167c8,'\x01');
  pfStack_167e8 = (fdb_doc *)0x119040;
  fdb_get_file_info(pfStack_167c8,&fStack_16758);
  if (fStack_16758.doc_count != 3000) {
    pfStack_167e8 = (fdb_doc *)0x119057;
    long_key_test();
  }
  lVar10 = 0;
  while( true ) {
    pfStack_167e8 = (fdb_doc *)0x119086;
    fdb_doc_create(&pfStack_167d0,apfStack_16310[lVar10]->key,apfStack_16310[lVar10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_167e8 = (fdb_doc *)0x119095;
    fVar3 = fdb_get(pfStack_167b8,pfStack_167d0);
    doc = pfStack_167d0;
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    doc_01 = (fdb_doc **)pfStack_167d0->key;
    __s = apfStack_16310[lVar10];
    pcVar14 = (char *)__s->key;
    pfStack_167e8 = (fdb_doc *)0x1190c0;
    iVar4 = bcmp(doc_01,pcVar14,pfStack_167d0->keylen);
    pfVar12 = doc;
    if (iVar4 != 0) {
      pfStack_167e8 = (fdb_doc *)0x1191a4;
      long_key_test();
      break;
    }
    doc_01 = (fdb_doc **)doc->meta;
    pcVar14 = (char *)__s->meta;
    pfStack_167e8 = (fdb_doc *)0x1190df;
    iVar4 = bcmp(doc_01,pcVar14,doc->metalen);
    if (iVar4 != 0) goto LAB_001191b4;
    doc_01 = (fdb_doc **)doc->body;
    pcVar14 = (char *)__s->body;
    pfStack_167e8 = (fdb_doc *)0x1190fe;
    iVar4 = bcmp(doc_01,pcVar14,doc->bodylen);
    if (iVar4 != 0) goto LAB_001191a9;
    pfStack_167e8 = (fdb_doc *)0x11910e;
    fdb_doc_free(doc);
    pfStack_167d0 = (fdb_doc *)0x0;
    lVar10 = lVar10 + 1;
    if (lVar10 == 3000) {
      pfStack_167e8 = (fdb_doc *)0x119131;
      fdb_close(pfStack_167c8);
      lVar10 = 0;
      do {
        pfStack_167e8 = (fdb_doc *)0x119140;
        fdb_doc_free(apfStack_16310[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3000);
      pfStack_167e8 = (fdb_doc *)0x119151;
      fdb_shutdown();
      pfStack_167e8 = (fdb_doc *)0x119156;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (long_key_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pfStack_167e8 = (fdb_doc *)0x119187;
      fprintf(_stderr,pcVar14,"long key test");
      return;
    }
  }
  pfStack_167e8 = (fdb_doc *)0x1191a9;
  long_key_test();
LAB_001191a9:
  pfStack_167e8 = (fdb_doc *)0x1191b4;
  long_key_test();
LAB_001191b4:
  pfStack_167e8 = (fdb_doc *)open_multi_files_kvs_test;
  long_key_test();
  pfStack_1ace0 = (fdb_kvs_handle *)0x1191df;
  ppfStack_16810 = &pfStack_167d0;
  pcStack_16808 = pcVar14;
  lStack_16800 = lVar10;
  pfStack_167f8 = pfVar12;
  ppfStack_167f0 = doc_01;
  pfStack_167e8 = __s;
  gettimeofday((timeval *)(auStack_1ac58 + 0x30),(__timezone_ptr_t)0x0);
  pfStack_1ace0 = (fdb_kvs_handle *)0x1191e4;
  memleak_start();
  pfStack_1ace0 = (fdb_kvs_handle *)0x1191f0;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1ace0 = (fdb_kvs_handle *)0x119200;
  fdb_get_default_config();
  pfStack_1ace0 = (fdb_kvs_handle *)0x11920a;
  fdb_get_default_kvs_config();
  fStack_1ab10.wal_threshold = 0x400;
  fStack_1ab10.compaction_mode = '\0';
  fStack_1ab10.durability_opt = '\x02';
  handle = (char *)&fStack_1a818;
  doc_00 = apfStack_1aa18;
  pcVar14 = "kvs%d";
  uVar15 = 0;
  ptr_iterator = (fdb_iterator **)0x0;
  do {
    pfStack_1ace0 = (fdb_kvs_handle *)0x11924a;
    sprintf((char *)doc_00,"dummy%d",(ulong)ptr_iterator & 0xffffffff);
    ptr_handle_00 = (char *)(apfStack_1ac98 + (long)ptr_iterator);
    pfStack_1ace0 = (fdb_kvs_handle *)0x119265;
    fVar3 = fdb_open((fdb_file_handle **)ptr_handle_00,(char *)doc_00,&fStack_1ab10);
    pfVar8 = (fdb_kvs_handle *)handle;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011969e;
    ppfVar2 = (fdb_iterator **)0x0;
    ppfStack_1acc0 = ptr_iterator;
    pfStack_1acb8 = (fdb_kvs_handle *)handle;
    do {
      ptr_iterator = ppfVar2;
      pfStack_1ace0 = (fdb_kvs_handle *)0x11928b;
      sprintf((char *)doc_00,"kvs%d",(ulong)(uint)((int)ptr_iterator + (int)uVar15));
      pfStack_1ace0 = (fdb_kvs_handle *)0x11929e;
      fVar3 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)ptr_handle_00,
                           (fdb_kvs_handle **)handle,(char *)doc_00,&fStack_1acb0);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1ace0 = (fdb_kvs_handle *)0x11968a;
        open_multi_files_kvs_test();
        goto LAB_0011968a;
      }
      handle = (char *)&(((fdb_kvs_handle *)handle)->kvs_config).custom_cmp;
      ppfVar2 = (fdb_iterator **)((long)ptr_iterator + 1);
    } while ((fdb_iterator **)((long)ptr_iterator + 1) != (fdb_iterator **)0x80);
    ptr_iterator = (fdb_iterator **)((long)ppfStack_1acc0 + 1);
    uVar15 = uVar15 + 0x80;
    handle = (char *)&pfStack_1acb8[1].bub_ctx.space_used;
  } while (ptr_iterator != (fdb_iterator **)0x8);
  ptr_iterator = apfStack_1ac18;
  doc_00 = apfStack_1a918;
  pfVar8 = (fdb_kvs_handle *)0x0;
  do {
    uVar15 = 0;
    do {
      pfStack_1ace0 = (fdb_kvs_handle *)0x119300;
      sprintf((char *)ptr_iterator,"key%08d",uVar15);
      pfStack_1ace0 = (fdb_kvs_handle *)0x119313;
      sprintf((char *)doc_00,"value%08d",uVar15);
      pcVar14 = *(char **)(&fStack_1a818.kvs_config.create_if_missing + (long)pfVar8 * 8);
      pfStack_1ace0 = (fdb_kvs_handle *)0x119323;
      sVar5 = strlen((char *)ptr_iterator);
      ptr_handle_00 = (char *)(sVar5 + 1);
      pfStack_1ace0 = (fdb_kvs_handle *)0x11932f;
      sVar5 = strlen((char *)doc_00);
      pfStack_1ace0 = (fdb_kvs_handle *)0x119344;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)pcVar14,ptr_iterator,(size_t)ptr_handle_00,doc_00,
                         sVar5 + 1);
      handle = (char *)pfVar8;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011968a;
      uVar9 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar9;
    } while (uVar9 != 10);
    pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).field_0x1;
  } while (pfVar8 != (fdb_kvs_handle *)0x400);
  ptr_handle_00 = (char *)0x0;
  do {
    if (((ulong)ptr_handle_00 & 1) == 0) {
      pfStack_1ace0 = (fdb_kvs_handle *)0x119372;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1ac98[(long)ptr_handle_00],'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196bc;
    }
    else {
      pfStack_1ace0 = (fdb_kvs_handle *)0x119385;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1ac98[(long)ptr_handle_00],'\x01');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c1;
    }
    ptr_handle_00 = (char *)((long)ptr_handle_00 + 1);
  } while ((fdb_kvs_handle **)ptr_handle_00 != (fdb_kvs_handle **)0x8);
  doc_00 = (fdb_iterator **)0xffffffffffffff80;
  ptr_handle_00 = (char *)apfStack_18818;
  ptr_iterator = (fdb_iterator **)(auStack_1ac58 + 8);
  pfVar8 = (fdb_kvs_handle *)auStack_1ac58;
  do {
    pfStack_1ace0 = (fdb_kvs_handle *)0x1193c5;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1a418[(long)doc_00],(fdb_kvs_info *)pfVar8);
    if ((fdb_custom_cmp_variable)auStack_1ac58._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_1ace0 = (fdb_kvs_handle *)0x11940b;
      open_multi_files_kvs_test();
    }
    pfStack_1ace0 = (fdb_kvs_handle *)0x1193e5;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1a418[(long)doc_00],
                              (fdb_kvs_handle **)ptr_handle_00,10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a3;
    doc_00 = doc_00 + 0x10;
    ptr_handle_00 = (char *)((long)ptr_handle_00 + 0x400);
  } while (doc_00 < (fdb_iterator **)0x380);
  ptr_handle_00 = (char *)0x0;
  do {
    pfStack_1ace0 = (fdb_kvs_handle *)0x11941b;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1ac98[(long)ptr_handle_00],(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a8;
    ptr_handle_00 = (char *)((long)ptr_handle_00 + 1);
  } while ((fdb_kvs_handle **)ptr_handle_00 != (fdb_kvs_handle **)0x8);
  ptr_handle_00 = (char *)&pfStack_1acc8;
  pfStack_1acc8 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &pfStack_1acd0;
  handle = "key%08d";
  doc_00 = apfStack_1ac18;
  pfVar8 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1ace0 = (fdb_kvs_handle *)0x119470;
    fdb_iterator_init(apfStack_18818[(long)pfVar8],ptr_iterator,(void *)0x0,0,(void *)0x0,0,0);
    uVar15 = 0;
    do {
      pfStack_1ace0 = (fdb_kvs_handle *)0x11947f;
      fVar3 = fdb_iterator_get(pfStack_1acd0,(fdb_doc **)ptr_handle_00);
      pcVar14 = (char *)pfVar8;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011968f;
      pfStack_1ace0 = (fdb_kvs_handle *)0x119496;
      sprintf((char *)doc_00,"key%08d",uVar15);
      pfStack_1ace0 = (fdb_kvs_handle *)0x1194a7;
      iVar4 = strcmp((char *)doc_00,(char *)pfStack_1acc8->op_stats);
      if (iVar4 != 0) {
        pfStack_1ace0 = (fdb_kvs_handle *)0x1194c9;
        open_multi_files_kvs_test();
      }
      uVar15 = (ulong)((int)uVar15 + 1);
      pfStack_1ace0 = (fdb_kvs_handle *)0x1194b7;
      fVar3 = fdb_iterator_next(pfStack_1acd0);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1ace0 = (fdb_kvs_handle *)0x1194d5;
    fdb_iterator_close(pfStack_1acd0);
    pcVar14 = (char *)&(pfVar8->config).wal_threshold;
    bVar16 = pfVar8 < (fdb_kvs_handle *)0x380;
    pfVar8 = (fdb_kvs_handle *)pcVar14;
  } while (bVar16);
  pfStack_1ace0 = (fdb_kvs_handle *)0x1194f6;
  fdb_doc_free((fdb_doc *)pfStack_1acc8);
  ptr_handle_00 = "key%08d";
  ptr_iterator = apfStack_1ac18;
  doc_00 = (fdb_iterator **)0x0;
  do {
    uVar15 = 0;
    do {
      pfStack_1ace0 = (fdb_kvs_handle *)0x119519;
      sprintf((char *)ptr_iterator,"key%08d",uVar15);
      handle = *(char **)(&fStack_1a818.kvs_config.create_if_missing + (long)doc_00 * 8);
      pfStack_1ace0 = (fdb_kvs_handle *)0x119529;
      sVar5 = strlen((char *)ptr_iterator);
      pfStack_1ace0 = (fdb_kvs_handle *)0x119538;
      fVar3 = fdb_del_kv((fdb_kvs_handle *)handle,ptr_iterator,sVar5 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119694;
      uVar9 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar9;
    } while (uVar9 != 10);
    doc_00 = (fdb_iterator **)((long)doc_00 + 1);
  } while (doc_00 != (fdb_iterator **)0x400);
  ptr_handle_00 = "dummy_compact%d";
  ptr_iterator = apfStack_1aa18;
  pfVar8 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1ace0 = (fdb_kvs_handle *)0x119575;
    sprintf((char *)ptr_iterator,"dummy_compact%d",(ulong)pfVar8 & 0xffffffff);
    pfStack_1ace0 = (fdb_kvs_handle *)0x119582;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1ac98[(long)pfVar8],(char *)ptr_iterator);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ad;
    pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).field_0x1;
  } while (pfVar8 != (fdb_kvs_handle *)0x8);
  ptr_handle_00 = (char *)&pfStack_1acc8;
  pfStack_1acc8 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &pfStack_1acd0;
  handle = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_1ace0 = (fdb_kvs_handle *)0x1195c8;
    fVar3 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&fStack_1a818.kvs_config.create_if_missing + (long)handle * 8),
                              ptr_iterator,(void *)0x0,0,(void *)0x0,0,2);
    pfVar8 = (fdb_kvs_handle *)handle;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b2;
    do {
      pfStack_1ace0 = (fdb_kvs_handle *)0x1195dd;
      fVar3 = fdb_iterator_get(pfStack_1acd0,(fdb_doc **)ptr_handle_00);
      if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00119699;
      pfStack_1ace0 = (fdb_kvs_handle *)0x1195ef;
      fVar3 = fdb_iterator_next(pfStack_1acd0);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1ace0 = (fdb_kvs_handle *)0x1195fe;
    fdb_iterator_close(pfStack_1acd0);
    pfVar8 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)handle)->config).wal_threshold;
    bVar16 = handle < (fdb_kvs_handle *)0x380;
    handle = (char *)pfVar8;
  } while (bVar16);
  pfStack_1ace0 = (fdb_kvs_handle *)0x11961b;
  fdb_doc_free((fdb_doc *)pfStack_1acc8);
  ptr_handle_00 = (char *)0x0;
  while( true ) {
    pfStack_1ace0 = (fdb_kvs_handle *)0x119627;
    fVar3 = fdb_close((fdb_file_handle *)apfStack_1ac98[(long)ptr_handle_00]);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ptr_handle_00 = (char *)((long)ptr_handle_00 + 1);
    if ((fdb_kvs_handle **)ptr_handle_00 == (fdb_kvs_handle **)0x8) {
      pfStack_1ace0 = (fdb_kvs_handle *)0x11963d;
      fdb_shutdown();
      pfStack_1ace0 = (fdb_kvs_handle *)0x119642;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pfStack_1ace0 = (fdb_kvs_handle *)0x119673;
      fprintf(_stderr,pcVar14,"open multi files kvs test");
      return;
    }
  }
LAB_001196b7:
  pfStack_1ace0 = (fdb_kvs_handle *)0x1196bc;
  open_multi_files_kvs_test();
LAB_001196bc:
  pfStack_1ace0 = (fdb_kvs_handle *)0x1196c1;
  open_multi_files_kvs_test();
LAB_001196c1:
  pfStack_1ace0 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_1b058 = (code *)0x1196e0;
  ppfStack_1acf8 = (fdb_kvs_handle **)ptr_handle_00;
  ppfStack_1acf0 = doc_00;
  ppfStack_1ace8 = ptr_iterator;
  pfStack_1ace0 = pfVar8;
  gettimeofday(&tStack_1b008,(__timezone_ptr_t)0x0);
  pcStack_1b058 = (code *)0x1196e5;
  memleak_start();
  pcStack_1b058 = (code *)0x1196f1;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar13 = &fStack_1aff8;
  pcStack_1b058 = (code *)0x1196fe;
  fdb_get_default_config();
  pcStack_1b058 = (code *)0x119708;
  fdb_get_default_kvs_config();
  pcStack_1b058 = (code *)0x11971c;
  fVar3 = fdb_open(&pfStack_1b038,"./dummy1",pfVar13);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_1b058 = (code *)0x11973f;
    fVar3 = fdb_kvs_open(pfStack_1b038,&pfStack_1b030,"db",&fStack_1b020);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198f2;
    pcStack_1b058 = (code *)0x119762;
    fVar3 = fdb_kvs_open(pfStack_1b038,&pfStack_1b028,"db2",&fStack_1b020);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198f7;
    pfVar13 = &fStack_1ae00;
    pcStack_1b058 = (code *)0x119785;
    sprintf((char *)pfVar13,"key%d",0);
    ptr_iterator = apfStack_1af00;
    pcStack_1b058 = (code *)0x1197a0;
    sprintf((char *)ptr_iterator,"body%d",0);
    pcStack_1b058 = (code *)0x1197a8;
    pfVar8 = (fdb_kvs_handle *)strlen((char *)pfVar13);
    pcStack_1b058 = (code *)0x1197b3;
    sVar5 = strlen((char *)ptr_iterator);
    doc_00 = &pfStack_1b040;
    pcStack_1b058 = (code *)0x1197d5;
    fdb_doc_create((fdb_doc **)doc_00,pfVar13,(size_t)pfVar8,(void *)0x0,0,ptr_iterator,sVar5 + 1);
    pcStack_1b058 = (code *)0x1197e3;
    fVar3 = fdb_set(pfStack_1b030,(fdb_doc *)pfStack_1b040);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198fc;
    pcStack_1b058 = (code *)0x1197fa;
    fVar3 = fdb_commit(pfStack_1b038,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119901;
    pcStack_1b058 = (code *)0x11981b;
    sprintf((char *)pfStack_1b040->tree_cursor_prev,"bOdy%d",0);
    pcStack_1b058 = (code *)0x11982a;
    fVar3 = fdb_set(pfStack_1b028,(fdb_doc *)pfStack_1b040);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119906;
    pcStack_1b058 = (code *)0x119841;
    fVar3 = fdb_commit(pfStack_1b038,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011990b;
    pcStack_1b058 = (code *)0x119858;
    fVar3 = fdb_get_metaonly(pfStack_1b030,(fdb_doc *)pfStack_1b040);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119910;
    pcStack_1b058 = (code *)0x11986f;
    fVar3 = fdb_get_metaonly(pfStack_1b028,(fdb_doc *)pfStack_1b040);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119915;
    pcStack_1b058 = (code *)0x119886;
    fVar3 = fdb_get_byoffset(pfStack_1b030,(fdb_doc *)pfStack_1b040);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_1b058 = (code *)0x119899;
      fdb_close(pfStack_1b038);
      pcStack_1b058 = (code *)0x1198a3;
      fdb_doc_free((fdb_doc *)pfStack_1b040);
      pcStack_1b058 = (code *)0x1198a8;
      fdb_shutdown();
      pcStack_1b058 = (code *)0x1198ad;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pcStack_1b058 = (code *)0x1198de;
      fprintf(_stderr,pcVar14,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_1b058 = (code *)0x1198f2;
    get_byoffset_diff_kvs_test();
LAB_001198f2:
    pcStack_1b058 = (code *)0x1198f7;
    get_byoffset_diff_kvs_test();
LAB_001198f7:
    pcStack_1b058 = (code *)0x1198fc;
    get_byoffset_diff_kvs_test();
LAB_001198fc:
    pcStack_1b058 = (code *)0x119901;
    get_byoffset_diff_kvs_test();
LAB_00119901:
    pcStack_1b058 = (code *)0x119906;
    get_byoffset_diff_kvs_test();
LAB_00119906:
    pcStack_1b058 = (code *)0x11990b;
    get_byoffset_diff_kvs_test();
LAB_0011990b:
    pcStack_1b058 = (code *)0x119910;
    get_byoffset_diff_kvs_test();
LAB_00119910:
    pcStack_1b058 = (code *)0x119915;
    get_byoffset_diff_kvs_test();
LAB_00119915:
    pcStack_1b058 = (code *)0x11991a;
    get_byoffset_diff_kvs_test();
  }
  pcStack_1b058 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_1b080 = pfVar13;
  ppfStack_1b078 = doc_00;
  pfStack_1b070 = (fdb_kvs_handle *)pcVar14;
  ppfStack_1b068 = ptr_iterator;
  pfStack_1b060 = pfVar8;
  pcStack_1b058 = (code *)uVar15;
  gettimeofday(&tStack_1b490,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1b480.wal_threshold = 0x400;
  fStack_1b480.flags = 1;
  fStack_1b480.purging_interval = 0;
  fStack_1b480.compaction_threshold = '\0';
  fStack_1b480.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_1b480.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_1b4e8,"./dummy1",&fStack_1b480);
  fdb_kvs_open_default(pfStack_1b4e8,&pfStack_1b4f0,&fStack_1b4a8);
  fVar3 = fdb_set_log_callback(pfStack_1b4f0,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_set_kv(pfStack_1b4f0,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00119c74;
    uVar15 = 0;
    do {
      sprintf(acStack_1b288,"key%d",uVar15);
      sprintf(acStack_1b188,"body%d",uVar15);
      pfVar8 = pfStack_1b4f0;
      sVar5 = strlen(acStack_1b288);
      sVar6 = strlen(acStack_1b188);
      fVar3 = fdb_set_kv(pfVar8,acStack_1b288,sVar5,acStack_1b188,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119c56;
      }
      uVar9 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar9;
    } while (uVar9 != 10);
    asStack_1b4d8[1] = 0x726162ffffffff;
    asStack_1b4d8[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_1b4c0 = 0xbdbdbdbd;
    uStack_1b4bc = 0xbdbdbdbd;
    uStack_1b4b8 = 0xbdbdbdbd;
    uStack_1b4b4 = 0xbdbdbdbd;
    uStack_1b4b0 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_rekey(pfStack_1b4e8,new_key);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c79;
    fdb_kvs_close(pfStack_1b4f0);
    fdb_close(pfStack_1b4e8);
    fStack_1b480.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_1b480.encryption_key.bytes,"bar",4);
    fStack_1b480.encryption_key.bytes[4] = 0xbd;
    fStack_1b480.encryption_key.bytes[5] = 0xbd;
    fStack_1b480.encryption_key.bytes[6] = 0xbd;
    fStack_1b480.encryption_key.bytes[7] = 0xbd;
    fStack_1b480.encryption_key.bytes[8] = 0xbd;
    fStack_1b480.encryption_key.bytes[9] = 0xbd;
    fStack_1b480.encryption_key.bytes[10] = 0xbd;
    fStack_1b480.encryption_key.bytes[0xb] = 0xbd;
    fStack_1b480.encryption_key.bytes[0xc] = 0xbd;
    fStack_1b480.encryption_key.bytes[0xd] = 0xbd;
    fStack_1b480.encryption_key.bytes[0xe] = 0xbd;
    fStack_1b480.encryption_key.bytes[0xf] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x10] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x11] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x12] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x13] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x14] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x15] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x16] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x17] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x18] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x19] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x1a] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x1b] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x1c] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x1d] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x1e] = 0xbd;
    fStack_1b480.encryption_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_open(&pfStack_1b4e8,"./dummy1",&fStack_1b480);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c80;
    fVar3 = fdb_kvs_open_default(pfStack_1b4e8,&pfStack_1b4f0,&fStack_1b4a8);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_set_log_callback(pfStack_1b4f0,logCallbackFunc,"api_wrapper_test");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c8e;
      uVar15 = 0;
      while( true ) {
        sprintf(acStack_1b288,"key%d",uVar15);
        pfVar8 = pfStack_1b4f0;
        sVar5 = strlen(acStack_1b288);
        fVar3 = fdb_get_kv(pfVar8,acStack_1b288,sVar5,&pvStack_1b4e0,asStack_1b4d8);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_1b388,"body%d",uVar15);
        ptr = pvStack_1b4e0;
        iVar4 = bcmp(pvStack_1b4e0,acStack_1b388,asStack_1b4d8[0]);
        if (iVar4 != 0) goto LAB_00119c56;
        fdb_free_block(ptr);
        uVar9 = (int)uVar15 + 1;
        uVar15 = (ulong)uVar9;
        if (uVar9 == 10) {
          fdb_kvs_close(pfStack_1b4f0);
          fdb_close(pfStack_1b4e8);
          fdb_shutdown();
          memleak_end();
          pcVar14 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar14 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar14,"encryption rekey test");
          return;
        }
      }
LAB_00119c66:
      rekey_test();
      goto LAB_00119c6d;
    }
  }
  else {
LAB_00119c6d:
    rekey_test();
LAB_00119c74:
    rekey_test();
LAB_00119c79:
    rekey_test();
LAB_00119c80:
    rekey_test();
  }
  rekey_test();
LAB_00119c8e:
  rekey_test();
  return;
LAB_0011968a:
  pfStack_1ace0 = (fdb_kvs_handle *)0x11968f;
  open_multi_files_kvs_test();
LAB_0011968f:
  pfStack_1ace0 = (fdb_kvs_handle *)0x119694;
  open_multi_files_kvs_test();
LAB_00119694:
  pfStack_1ace0 = (fdb_kvs_handle *)0x119699;
  open_multi_files_kvs_test();
LAB_00119699:
  pfStack_1ace0 = (fdb_kvs_handle *)0x11969e;
  open_multi_files_kvs_test();
  pfVar8 = (fdb_kvs_handle *)handle;
LAB_0011969e:
  pfStack_1ace0 = (fdb_kvs_handle *)0x1196a3;
  open_multi_files_kvs_test();
LAB_001196a3:
  pfStack_1ace0 = (fdb_kvs_handle *)0x1196a8;
  open_multi_files_kvs_test();
LAB_001196a8:
  pfStack_1ace0 = (fdb_kvs_handle *)0x1196ad;
  open_multi_files_kvs_test();
LAB_001196ad:
  pfStack_1ace0 = (fdb_kvs_handle *)0x1196b2;
  open_multi_files_kvs_test();
LAB_001196b2:
  pfStack_1ace0 = (fdb_kvs_handle *)0x1196b7;
  open_multi_files_kvs_test();
  goto LAB_001196b7;
LAB_00119c56:
  rekey_test();
  goto LAB_00119c66;
}

Assistant:

void last_wal_flush_header_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 30;
    fdb_file_handle *dbfile, *dbfile_txn1, *dbfile_txn2;
    fdb_kvs_handle *db, *db_txn1, *db_txn2;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);

    // create docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
    }

    // insert docs without transaction
    for (i=0;i<2;++i) {
        fdb_set(db, doc[i]);
    }
    // insert docs using transaction
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    for (i=2;i<4;++i){
        fdb_set(db_txn1, doc[i]);
    }
    // commit without transaction
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // close & reopen db
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);

    // retrieve check
    for (i=0;i<4;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<2) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // insert docs using transaction
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    for (i=2;i<4;++i){
        fdb_set(db_txn1, doc[i]);
    }
    // insert docs without transaction
    for (i=4;i<6;++i){
        fdb_set(db, doc[i]);
    }
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // close & reopen db
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);

    // retrieve check
    for (i=0;i<6;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<4) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            // doesn't matter
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // insert docs without transaction
    for (i=4;i<6;++i) {
        fdb_set(db, doc[i]);
    }
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    for (i=6;i<8;++i) {
        fdb_set(db_txn1, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // begin another transaction
    fdb_open(&dbfile_txn2, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile_txn2, &db_txn2, &kvs_config);
    fdb_begin_transaction(dbfile_txn2, FDB_ISOLATION_READ_COMMITTED);
    for (i=8;i<10;++i){
        fdb_set(db_txn2, doc[i]);
    }
    fdb_end_transaction(dbfile_txn2, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // close & reopen db
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_close(dbfile_txn2);
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // retrieve check
    for (i=0;i<10;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<6 || i>=8) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_open(&dbfile_txn2, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);
    fdb_kvs_open_default(dbfile_txn2, &db_txn2, &kvs_config);
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);

    fdb_set(db, doc[10]);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    fdb_set(db, doc[11]);
    fdb_set(db_txn1, doc[12]);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    fdb_set(db_txn1, doc[13]);
    fdb_begin_transaction(dbfile_txn2, FDB_ISOLATION_READ_COMMITTED);
    fdb_set(db_txn2, doc[14]);
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_MANUAL_WAL_FLUSH);

    fdb_set(db_txn2, doc[15]);
    fdb_set(db, doc[16]);
    fdb_end_transaction(dbfile_txn2, FDB_COMMIT_MANUAL_WAL_FLUSH);

    fdb_set(db, doc[17]);
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_close(dbfile_txn2);
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // retrieve check
    for (i=10;i<18;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    fdb_set(db_txn1, doc[20]);

    fdb_compact(dbfile, "dummy2");

    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_MANUAL_WAL_FLUSH);
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("last wal flush header test");
}